

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void __thiscall libtorrent::aux::random_bytes(aux *this,span<char> buffer)

{
  long lVar1;
  char *pcVar2;
  
  for (pcVar2 = (char *)0x0; buffer.m_ptr != pcVar2; pcVar2 = pcVar2 + 1) {
    lVar1 = random((aux *)0xff);
    this[(long)pcVar2] = SUB81(lVar1,0);
  }
  return;
}

Assistant:

void random_bytes(span<char> buffer)
		{
#ifdef TORRENT_BUILD_SIMULATOR
			// simulator
			for (auto& b : buffer) b = char(random(0xff));
#else
			std::generate(buffer.begin(), buffer.end(), [] { return char(random(0xff)); });
#endif
		}